

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

int ON_CompareFloat(float a,float b)

{
  int iVar1;
  
  iVar1 = -1;
  if ((b <= a) && (iVar1 = 1, a <= b)) {
    iVar1 = 0;
    if (((a != b) || (NAN(a) || NAN(b))) && (iVar1 = -1, NAN(a))) {
      return (int)!NAN(b);
    }
  }
  return iVar1;
}

Assistant:

int ON_CompareFloat(
  float a,
  float b
  )
{
  if (a < b)
    return -1;
  if (a > b)
    return 1;
  if (a == b)
    return 0;

  // below this point, a and/or b is a nan


  if (a == a)
    return -1; // b is a nan
  
  if (b == b)
    return 1; // ab is a nan

  return 0; // both a and b are nans
}